

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall sf::RenderTarget::applyTransform(RenderTarget *this,Transform *transform)

{
  PFNGLLOADMATRIXFPROC p_Var1;
  bool bVar2;
  float *pfVar3;
  Transform *in_RSI;
  Transform *in_RDI;
  Transform *unaff_retaddr;
  
  bVar2 = sf::operator==(unaff_retaddr,in_RDI);
  p_Var1 = sf_glad_glLoadMatrixf;
  if (bVar2) {
    (*sf_glad_glLoadIdentity)();
  }
  else {
    pfVar3 = Transform::getMatrix(in_RSI);
    (*p_Var1)(pfVar3);
  }
  return;
}

Assistant:

void RenderTarget::applyTransform(const Transform& transform)
{
    // No need to call glMatrixMode(GL_MODELVIEW), it is always the
    // current mode (for optimization purpose, since it's the most used)
    if (transform == Transform::Identity)
        glCheck(glLoadIdentity());
    else
        glCheck(glLoadMatrixf(transform.getMatrix()));
}